

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

opStatus __thiscall
llvm::APFloat::convert(APFloat *this,fltSemantics *ToSemantics,roundingMode RM,bool *losesInfo)

{
  bool bVar1;
  fltSemantics *pfVar2;
  IEEEFloat *pIVar3;
  IEEEFloat local_a8;
  APFloat local_90;
  opStatus local_6c;
  undefined1 local_68 [4];
  opStatus Ret_1;
  APFloat local_58;
  opStatus local_34;
  bool *pbStack_30;
  opStatus Ret;
  bool *losesInfo_local;
  fltSemantics *pfStack_20;
  roundingMode RM_local;
  fltSemantics *ToSemantics_local;
  APFloat *this_local;
  
  pbStack_30 = losesInfo;
  losesInfo_local._4_4_ = RM;
  pfStack_20 = ToSemantics;
  ToSemantics_local = (fltSemantics *)this;
  pfVar2 = getSemantics(this);
  if (pfVar2 == pfStack_20) {
    *pbStack_30 = false;
    this_local._4_4_ = opOK;
  }
  else {
    pfVar2 = getSemantics(this);
    bVar1 = usesLayout<llvm::detail::IEEEFloat>(pfVar2);
    if ((bVar1) && (bVar1 = usesLayout<llvm::detail::IEEEFloat>(pfStack_20), bVar1)) {
      this_local._4_4_ =
           detail::IEEEFloat::convert(&(this->U).IEEE,pfStack_20,losesInfo_local._4_4_,pbStack_30);
    }
    else {
      pfVar2 = getSemantics(this);
      bVar1 = usesLayout<llvm::detail::IEEEFloat>(pfVar2);
      if ((bVar1) && (bVar1 = usesLayout<llvm::detail::DoubleAPFloat>(pfStack_20), bVar1)) {
        if (pfStack_20 != (fltSemantics *)semPPCDoubleDouble) {
          __assert_fail("&ToSemantics == &semPPCDoubleDouble",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                        ,0x116a,
                        "APFloat::opStatus llvm::APFloat::convert(const fltSemantics &, roundingMode, bool *)"
                       );
        }
        local_34 = detail::IEEEFloat::convert
                             (&(this->U).IEEE,(fltSemantics *)semPPCDoubleDoubleLegacy,
                              losesInfo_local._4_4_,pbStack_30);
        pfVar2 = pfStack_20;
        detail::IEEEFloat::bitcastToAPInt((IEEEFloat *)local_68);
        APFloat(&local_58,pfVar2,(APInt *)local_68);
        operator=(this,&local_58);
        ~APFloat(&local_58);
        APInt::~APInt((APInt *)local_68);
        this_local._4_4_ = local_34;
      }
      else {
        pfVar2 = getSemantics(this);
        bVar1 = usesLayout<llvm::detail::DoubleAPFloat>(pfVar2);
        if ((!bVar1) || (bVar1 = usesLayout<llvm::detail::IEEEFloat>(pfStack_20), !bVar1)) {
          llvm_unreachable_internal
                    ("Unexpected semantics",
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                     ,0x1175);
        }
        pIVar3 = getIEEE(this);
        local_6c = detail::IEEEFloat::convert(pIVar3,pfStack_20,losesInfo_local._4_4_,pbStack_30);
        pIVar3 = getIEEE(this);
        detail::IEEEFloat::IEEEFloat(&local_a8,pIVar3);
        APFloat(&local_90,&local_a8,pfStack_20);
        operator=(this,&local_90);
        ~APFloat(&local_90);
        detail::IEEEFloat::~IEEEFloat(&local_a8);
        this_local._4_4_ = local_6c;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

APFloat::opStatus APFloat::convert(const fltSemantics &ToSemantics,
                                   roundingMode RM, bool *losesInfo) {
  if (&getSemantics() == &ToSemantics) {
    *losesInfo = false;
    return opOK;
  }
  if (usesLayout<IEEEFloat>(getSemantics()) &&
      usesLayout<IEEEFloat>(ToSemantics))
    return U.IEEE.convert(ToSemantics, RM, losesInfo);
  if (usesLayout<IEEEFloat>(getSemantics()) &&
      usesLayout<DoubleAPFloat>(ToSemantics)) {
    assert(&ToSemantics == &semPPCDoubleDouble);
    auto Ret = U.IEEE.convert(semPPCDoubleDoubleLegacy, RM, losesInfo);
    *this = APFloat(ToSemantics, U.IEEE.bitcastToAPInt());
    return Ret;
  }
  if (usesLayout<DoubleAPFloat>(getSemantics()) &&
      usesLayout<IEEEFloat>(ToSemantics)) {
    auto Ret = getIEEE().convert(ToSemantics, RM, losesInfo);
    *this = APFloat(std::move(getIEEE()), ToSemantics);
    return Ret;
  }
  llvm_unreachable("Unexpected semantics");
}